

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon_p.h
# Opt level: O0

bool QtIpcCommon::
     IpcStorageVariant<&QSystemSemaphorePrivate::Backend::posix,&QSystemSemaphorePrivate::Backend::sysv,&QSystemSemaphorePrivate::Backend::win32>
     ::staticVisit<QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type)::__0>
               (Type keyType,anon_class_1_0_00000001 *lambda)

{
  bool bVar1;
  anon_class_1_0_00000001 *in_RSI;
  Type in_DI;
  QSystemSemaphorePosix *in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  bVar1 = QSystemSemaphorePosix::supports(in_DI);
  if (bVar1) {
    local_1 = QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type)::$_0::operator()
                        (in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    local_1 = IpcStorageVariant<&QSystemSemaphorePrivate::Backend::sysv,&QSystemSemaphorePrivate::Backend::win32>
              ::staticVisit<QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type)::__0>
                        ((Type)((ulong)in_RSI >> 0x30),
                         (anon_class_1_0_00000001 *)in_stack_ffffffffffffffe8);
  }
  return local_1;
}

Assistant:

static auto
    staticVisit(QNativeIpcKey::Type keyType, const Lambda &lambda)
    {
        if constexpr ((IsEnabled<Member1> || ... || IsEnabled<Members>)) {
            if constexpr (IsEnabled<Member1>) {
                using MemberType1 = decltype(extractObject(Member1));
                if (MemberType1::supports(keyType))
                    return lambda(static_cast<MemberType1 *>(nullptr));
            }
            if constexpr ((... || IsEnabled<Members>))
                return IpcStorageVariant<Members...>::staticVisit(keyType, lambda);
            Q_UNREACHABLE();
        } else {
            // no backends enabled, but we can't return void
            return false;
        }
    }